

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O3

int ztlex_isdecimal(ztlex_t *lex)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  ulong uVar4;
  
  iVar1 = (*lex->getC)(lex);
  if (iVar1 == -1) {
    return -1;
  }
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (long)iVar1 * 2 + 1) & 8) == 0) {
    (*lex->ungetC)(iVar1,lex);
    return 0;
  }
  lex->lexeme[0] = (char)iVar1;
  iVar1 = (*lex->getC)(lex);
  lVar3 = 1;
  if (iVar1 != -1) {
    if (iVar1 == 0x2e) {
      lex->lexeme[1] = '.';
      iVar1 = (*lex->getC)(lex);
      if ((*(byte *)((long)*ppuVar2 + (long)iVar1 * 2 + 1) & 8) == 0) {
        lVar3 = 2;
      }
      else {
        lex->lexeme[2] = (char)iVar1;
        iVar1 = (*lex->getC)(lex);
        if ((*(byte *)((long)*ppuVar2 + (long)iVar1 * 2 + 1) & 8) != 0) {
          lex->lexeme[3] = (char)iVar1;
          lex->lexeme[4] = '\0';
          return 4;
        }
        lVar3 = 3;
      }
      if (iVar1 == -1) goto LAB_00103e5c;
    }
    (*lex->ungetC)(iVar1,lex);
  }
LAB_00103e5c:
  lVar3 = lVar3 + 0x127;
  do {
    (*lex->ungetC)((int)lex->ungotten[lVar3 + -0x10],lex);
    uVar4 = lVar3 - 0x127;
    lVar3 = lVar3 + -1;
  } while (1 < uVar4);
  return 0;
}

Assistant:

int ztlex_isdecimal(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (!isdigit(c))
  {
    lex->ungetC(c, lex);
    return 0;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (c != '.') /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (!isdigit(c)) /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (!isdigit(c)) /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  lex->lexeme[i] = '\0';
  return i;

undo:
  while (--i >= 0)
    lex->ungetC(lex->lexeme[i], lex);
  return 0;
}